

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_binding.hpp
# Opt level: O1

void __thiscall duckdb::Binding::Binding(Binding *this,Binding *param_1)

{
  pointer pcVar1;
  size_t sVar2;
  undefined4 uVar3;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>_>_>
  local_38;
  
  this->_vptr_Binding = (_func_int **)&PTR__Binding_0247bb50;
  this->binding_type = param_1->binding_type;
  (this->alias).catalog._M_dataplus._M_p = (pointer)&(this->alias).catalog.field_2;
  pcVar1 = (param_1->alias).catalog._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->alias,pcVar1,pcVar1 + (param_1->alias).catalog._M_string_length);
  (this->alias).schema._M_dataplus._M_p = (pointer)&(this->alias).schema.field_2;
  pcVar1 = (param_1->alias).schema._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->alias).schema,pcVar1,
             pcVar1 + (param_1->alias).schema._M_string_length);
  (this->alias).alias._M_dataplus._M_p = (pointer)&(this->alias).alias.field_2;
  pcVar1 = (param_1->alias).alias._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->alias).alias,pcVar1,pcVar1 + (param_1->alias).alias._M_string_length)
  ;
  this->index = param_1->index;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&(this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &(param_1->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&this->names,
           &(param_1->names).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  local_38._M_h = (__hashtable_alloc *)&this->name_map;
  (this->name_map)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->name_map)._M_h._M_bucket_count = (param_1->name_map)._M_h._M_bucket_count;
  (this->name_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->name_map)._M_h._M_element_count = (param_1->name_map)._M_h._M_element_count;
  uVar3 = *(undefined4 *)&(param_1->name_map)._M_h._M_rehash_policy.field_0x4;
  sVar2 = (param_1->name_map)._M_h._M_rehash_policy._M_next_resize;
  (this->name_map)._M_h._M_rehash_policy._M_max_load_factor =
       (param_1->name_map)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->name_map)._M_h._M_rehash_policy.field_0x4 = uVar3;
  (this->name_map)._M_h._M_rehash_policy._M_next_resize = sVar2;
  (this->name_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,unsigned_long>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_38._M_h,&(param_1->name_map)._M_h,&local_38);
  return;
}

Assistant:

virtual ~Binding() = default;